

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

string * duckdb::Exception::
         ConstructMessage<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                   (string *msg,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_2)

{
  string *in_RCX;
  string *in_RDX;
  string *in_RDI;
  string *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000018;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
  *in_stack_00000020;
  string *in_stack_00000028;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> values;
  size_t num_args;
  string local_b8 [32];
  string local_98 [48];
  string local_68 [56];
  undefined8 local_30;
  
  local_30 = 3;
  std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::vector
            ((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             0x996963);
  std::__cxx11::string::string(local_68,in_RDX);
  std::__cxx11::string::string(local_98,in_RCX);
  std::__cxx11::string::string(local_b8,in_R8);
  ConstructMessageRecursive<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010,
             in_stack_00000008);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_68);
  std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::~vector
            ((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             in_RDI);
  return in_RDI;
}

Assistant:

static string ConstructMessage(const string &msg, ARGS... params) {
		const std::size_t num_args = sizeof...(ARGS);
		if (num_args == 0) {
			return msg;
		}
		std::vector<ExceptionFormatValue> values;
		return ConstructMessageRecursive(msg, values, params...);
	}